

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location.hh
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
deci::operator<<(basic_ostream<char,_std::char_traits<char>_> *ostr,location *loc)

{
  bool bVar1;
  ostream *poVar2;
  int local_20;
  counter_type end_col;
  location *loc_local;
  basic_ostream<char,_std::char_traits<char>_> *ostr_local;
  
  if ((loc->end).column < 1) {
    local_20 = 0;
  }
  else {
    local_20 = (loc->end).column + -1;
  }
  operator<<(ostr,&loc->begin);
  if (((loc->end).filename == (filename_type *)0x0) ||
     (((loc->begin).filename != (filename_type *)0x0 &&
      (bVar1 = std::operator!=((loc->begin).filename,(loc->end).filename), !bVar1)))) {
    if ((loc->begin).line < (loc->end).line) {
      poVar2 = std::operator<<(ostr,'-');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(loc->end).line);
      poVar2 = std::operator<<(poVar2,'.');
      std::ostream::operator<<(poVar2,local_20);
    }
    else if ((loc->begin).column < local_20) {
      poVar2 = std::operator<<(ostr,'-');
      std::ostream::operator<<(poVar2,local_20);
    }
  }
  else {
    poVar2 = std::operator<<(ostr,'-');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(loc->end).filename);
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(loc->end).line);
    poVar2 = std::operator<<(poVar2,'.');
    std::ostream::operator<<(poVar2,local_20);
  }
  return ostr;
}

Assistant:

std::basic_ostream<YYChar>&
  operator<< (std::basic_ostream<YYChar>& ostr, const location& loc)
  {
    location::counter_type end_col
      = 0 < loc.end.column ? loc.end.column - 1 : 0;
    ostr << loc.begin;
    if (loc.end.filename
        && (!loc.begin.filename
            || *loc.begin.filename != *loc.end.filename))
      ostr << '-' << loc.end.filename << ':' << loc.end.line << '.' << end_col;
    else if (loc.begin.line < loc.end.line)
      ostr << '-' << loc.end.line << '.' << end_col;
    else if (loc.begin.column < end_col)
      ostr << '-' << end_col;
    return ostr;
  }